

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoopThreadPool.cpp
# Opt level: O2

void __thiscall
sznet::net::KcpTcpEventLoopThreadPool::start(KcpTcpEventLoopThreadPool *this,ThreadInitCallback *cb)

{
  size_t *psVar1;
  undefined8 *puVar2;
  pointer pIVar3;
  size_t sVar4;
  undefined8 uVar5;
  InetAddress m_udpLisetenAddr;
  uint __line;
  undefined8 uVar6;
  int seed;
  KcpTcpEventLoopThread *this_00;
  char *__assertion;
  ulong uVar7;
  undefined1 local_1460 [8];
  random_device rd;
  InetAddress addr;
  string local_90;
  undefined1 local_70 [8];
  vector<char,_std::allocator<char>_> vbuf;
  long local_48;
  allocator local_31;
  
  if (this->m_started == true) {
    __assertion = "!m_started";
    __line = 0x1f;
  }
  else {
    if (((long)(this->m_udpListenAddrs).
               super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_udpListenAddrs).
              super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x1c == (long)this->m_numThreads) {
      EventLoop::assertInLoopThread(&this->m_baseLoop->super_EventLoop);
      this->m_started = true;
      std::random_device::random_device((random_device *)local_1460);
      seed = std::random_device::_M_getval();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_70,
                 (this->m_name)._M_string_length + 0x20,(allocator_type *)&local_90);
      vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)&this->m_threads;
      local_48 = 0;
      for (uVar7 = 0; (long)uVar7 < (long)this->m_numThreads; uVar7 = uVar7 + 1) {
        snprintf((char *)local_70,
                 (long)vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start - (long)local_70,"%s%d",
                 (this->m_name)._M_dataplus._M_p,uVar7 & 0xffffffff);
        pIVar3 = (this->m_udpListenAddrs).
                 super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (size_t *)((long)&pIVar3->field_0 + local_48);
        rd.field_0._M_mt._M_p = *psVar1;
        sVar4 = psVar1[1];
        puVar2 = (undefined8 *)((long)&pIVar3->field_0 + local_48 + 0xc);
        uVar5 = puVar2[1];
        addr.field_0._8_4_ = (undefined4)((ulong)*puVar2 >> 0x20);
        addr.field_0.m_addr6.sin6_flowinfo = (uint32_t)(sVar4 >> 0x20);
        this_00 = (KcpTcpEventLoopThread *)operator_new(0x1b0);
        uVar6 = rd.field_0._M_mt._M_p;
        std::__cxx11::string::string((string *)&local_90,(char *)local_70,&local_31);
        seed = seed + (int)uVar7;
        m_udpLisetenAddr.field_0._8_4_ = (int)sVar4;
        m_udpLisetenAddr.field_0._0_8_ = uVar6;
        m_udpLisetenAddr.field_0._12_4_ = addr.field_0.m_addr6.sin6_flowinfo;
        m_udpLisetenAddr.field_0._16_4_ = addr.field_0._8_4_;
        m_udpLisetenAddr.field_0._20_8_ = uVar5;
        KcpTcpEventLoopThread::KcpTcpEventLoopThread(this_00,m_udpLisetenAddr,cb,&local_90,seed);
        std::__cxx11::string::~string((string *)&local_90);
        local_90._M_dataplus._M_p = (pointer)this_00;
        std::
        vector<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,std::default_delete<sznet::net::KcpTcpEventLoopThread>>,std::allocator<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,std::default_delete<sznet::net::KcpTcpEventLoopThread>>>>
        ::
        emplace_back<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,std::default_delete<sznet::net::KcpTcpEventLoopThread>>>
                  ((vector<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,std::default_delete<sznet::net::KcpTcpEventLoopThread>>,std::allocator<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,std::default_delete<sznet::net::KcpTcpEventLoopThread>>>>
                    *)vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                   (unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>
                    *)&local_90);
        std::
        unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>
        ::~unique_ptr((unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>
                       *)&local_90);
        local_90._M_dataplus._M_p = (pointer)KcpTcpEventLoopThread::startLoop(this_00);
        std::vector<sznet::net::KcpTcpEventLoop*,std::allocator<sznet::net::KcpTcpEventLoop*>>::
        emplace_back<sznet::net::KcpTcpEventLoop*>
                  ((vector<sznet::net::KcpTcpEventLoop*,std::allocator<sznet::net::KcpTcpEventLoop*>>
                    *)&this->m_loops,(KcpTcpEventLoop **)&local_90);
        local_48 = local_48 + 0x1c;
      }
      if ((this->m_numThreads == 0) && ((cb->super__Function_base)._M_manager != (_Manager_type)0x0)
         ) {
        std::function<void_(sznet::net::KcpTcpEventLoop_*)>::operator()(cb,this->m_baseLoop);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)local_70);
      std::random_device::~random_device((random_device *)local_1460);
      return;
    }
    __assertion = "m_numThreads == m_udpListenAddrs.size()";
    __line = 0x20;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoopThreadPool.cpp"
                ,__line,
                "void sznet::net::KcpTcpEventLoopThreadPool::start(const ThreadInitCallback &)");
}

Assistant:

void KcpTcpEventLoopThreadPool::start(const ThreadInitCallback& cb)
{
	assert(!m_started);
	assert(m_numThreads == m_udpListenAddrs.size()),
		m_baseLoop->assertInLoopThread();
	m_started = true;
	std::random_device rd;
	int initSeed = rd();

	std::vector<char> vbuf(m_name.size() + 32);
	for (int i = 0; i < m_numThreads; ++i)
	{
		snprintf(vbuf.data(), vbuf.size(), "%s%d", m_name.c_str(), i);
		InetAddress addr = m_udpListenAddrs[i];
		initSeed = initSeed + i;
		KcpTcpEventLoopThread* t = new KcpTcpEventLoopThread(addr, cb, vbuf.data(), initSeed);
		m_threads.push_back(std::unique_ptr<KcpTcpEventLoopThread>(t));
		// 阻塞
		// 启动EventLoopThread线程，在进入事件循环之前，会调用cb
		m_loops.push_back(t->startLoop());
	}
	// 只有一个EventLoop，在这个EventLoop进入事件循环之前，调用cb
	if (m_numThreads == 0 && cb)
	{
		cb(m_baseLoop);
	}
}